

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::CreateParallelTestCostList(cmCTestMultiProcessHandler *this)

{
  bool bVar1;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar2;
  reference __k;
  mapped_type *ppcVar3;
  set<int,std::less<int>,std::allocator<int>> *this_00;
  set<int,_std::less<int>,_std::allocator<int>_> *this_01;
  iterator __first;
  iterator __last;
  reference piVar4;
  reference key;
  int *j;
  iterator __end2_2;
  iterator __begin2_2;
  TestList *__range2_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_170;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_168;
  undefined1 local_160 [8];
  TestList sortedCopy;
  TestSet *currentSet_1;
  reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_> __end1_1;
  reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_> __begin1_1;
  cmRange<std::reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>_>
  *__range1_1;
  int *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  TestSet *__range2_1;
  TestSet *dependencies;
  int *i;
  iterator __end2;
  iterator __begin2;
  TestSet *__range2;
  TestSet *currentSet;
  TestSet *previousSet;
  pair<const_int,_cmCTestMultiProcessHandler::TestSet> *t;
  iterator __end1;
  iterator __begin1;
  TestMap *__range1;
  TestSet *topLevel;
  undefined1 local_58 [8];
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  priorityStack;
  TestSet alreadySortedTests;
  cmCTestMultiProcessHandler *this_local;
  
  TestSet::TestSet((TestSet *)
                   &priorityStack.
                    super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                    ._M_impl._M_node._M_size);
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  list((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
        *)local_58);
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  emplace_back<>((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  *)local_58);
  psVar2 = &std::__cxx11::
            list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                    *)local_58)->super_set<int,_std::less<int>,_std::allocator<int>_>;
  __end1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::begin(&(this->Tests).
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  );
  t = (pair<const_int,_cmCTestMultiProcessHandler::TestSet> *)
      std::
      map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::end(&(this->Tests).
             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           );
  while (bVar1 = std::operator!=(&__end1,(_Self *)&t), bVar1) {
    __k = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
          operator*(&__end1);
    ppcVar3 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&__k->first);
    bVar1 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&this->LastTestsFailed,&(*ppcVar3)->Name);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,&__k->first);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &priorityStack.
                  super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  ._M_impl._M_node._M_size,&__k->first);
    }
    else {
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert(psVar2,&__k->first);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&__end1);
  }
  while( true ) {
    psVar2 = &std::__cxx11::
              list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                      *)local_58)->super_set<int,_std::less<int>,_std::allocator<int>_>;
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(psVar2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    psVar2 = &std::__cxx11::
              list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                      *)local_58)->super_set<int,_std::less<int>,_std::allocator<int>_>;
    std::__cxx11::
    list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
    ::emplace_back<>((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                      *)local_58);
    this_00 = (set<int,std::less<int>,std::allocator<int>> *)
              std::__cxx11::
              list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              ::back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                      *)local_58);
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar2);
    i = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar2);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i), bVar1) {
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      this_01 = &std::
                 map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                 ::operator[](&(this->Tests).
                               super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                              ,piVar4)->super_set<int,_std::less<int>,_std::allocator<int>_>;
      __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_01);
      __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_01);
      std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
                (this_00,(_Rb_tree_const_iterator<int>)__first._M_node,
                 (_Rb_tree_const_iterator<int>)__last._M_node);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    __end2_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
    i_1 = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&i_1), bVar1) {
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*(&__end2_1);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase(psVar2,piVar4);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2_1);
    }
  }
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  pop_back((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
            *)local_58);
  cmReverseRange<std::__cxx11::list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>_>
            ((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
              *)&__begin1_1);
  cmRange<std::reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>_>::
  begin((cmRange<std::reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>_>
         *)&__end1_1);
  cmRange<std::reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>_>::
  end((cmRange<std::reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>_>
       *)&currentSet_1);
  while (bVar1 = std::operator!=(&__end1_1,
                                 (reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>
                                  *)&currentSet_1), bVar1) {
    sortedCopy.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>
                  ::operator*(&__end1_1);
    TestList::TestList((TestList *)local_160);
    ::cm::append<cmCTestMultiProcessHandler::TestList,_cmCTestMultiProcessHandler::TestSet,_0>
              ((TestList *)local_160,
               (TestSet *)
               sortedCopy.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    local_168._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_160);
    local_170._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_160);
    TestComparator::TestComparator((TestComparator *)&__range2_2,this);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TestComparator>
              (local_168,local_170,(TestComparator)__range2_2);
    __end2_2 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_160);
    j = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_160);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &j), bVar1) {
      key = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (&__end2_2);
      bVar1 = ::cm::contains<cmCTestMultiProcessHandler::TestSet,_int,_0>
                        ((TestSet *)
                         &priorityStack.
                          super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                          ._M_impl._M_node._M_size,key);
      if (!bVar1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&(this->SortedTests).super_vector<int,_std::allocator<int>_>,key);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   &priorityStack.
                    super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                    ._M_impl._M_node._M_size,key);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_2);
    }
    TestList::~TestList((TestList *)local_160);
    std::reverse_iterator<std::_List_const_iterator<cmCTestMultiProcessHandler::TestSet>_>::
    operator++(&__end1_1);
  }
  std::__cxx11::
  list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>::
  ~list((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
         *)local_58);
  TestSet::~TestSet((TestSet *)
                    &priorityStack.
                     super__List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                     ._M_impl._M_node._M_size);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateParallelTestCostList()
{
  TestSet alreadySortedTests;

  std::list<TestSet> priorityStack;
  priorityStack.emplace_back();
  TestSet& topLevel = priorityStack.back();

  // In parallel test runs add previously failed tests to the front
  // of the cost list and queue other tests for further sorting
  for (auto const& t : this->Tests) {
    if (cm::contains(this->LastTestsFailed, this->Properties[t.first]->Name)) {
      // If the test failed last time, it should be run first.
      this->SortedTests.push_back(t.first);
      alreadySortedTests.insert(t.first);
    } else {
      topLevel.insert(t.first);
    }
  }

  // In parallel test runs repeatedly move dependencies of the tests on
  // the current dependency level to the next level until no
  // further dependencies exist.
  while (!priorityStack.back().empty()) {
    TestSet& previousSet = priorityStack.back();
    priorityStack.emplace_back();
    TestSet& currentSet = priorityStack.back();

    for (auto const& i : previousSet) {
      TestSet const& dependencies = this->Tests[i];
      currentSet.insert(dependencies.begin(), dependencies.end());
    }

    for (auto const& i : currentSet) {
      previousSet.erase(i);
    }
  }

  // Remove the empty dependency level
  priorityStack.pop_back();

  // Reverse iterate over the different dependency levels (deepest first).
  // Sort tests within each level by COST and append them to the cost list.
  for (TestSet const& currentSet : cmReverseRange(priorityStack)) {
    TestList sortedCopy;
    cm::append(sortedCopy, currentSet);
    std::stable_sort(sortedCopy.begin(), sortedCopy.end(),
                     TestComparator(this));

    for (auto const& j : sortedCopy) {
      if (!cm::contains(alreadySortedTests, j)) {
        this->SortedTests.push_back(j);
        alreadySortedTests.insert(j);
      }
    }
  }
}